

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O2

pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *
snip_between(pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
             *__return_storage_ptr__,string_view source,string *from,string *to,size_t start)

{
  size_type sVar1;
  size_type sVar2;
  size_type __pos;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  undefined1 local_38 [8];
  string_view source_local;
  
  source_local._M_len = (size_t)source._M_str;
  local_38 = (undefined1  [8])source._M_len;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_38,
                     (from->_M_dataplus)._M_p,start,from->_M_string_length);
  if (sVar1 != 0xffffffffffffffff) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_38,
                       (to->_M_dataplus)._M_p,from->_M_string_length + sVar1,to->_M_string_length);
    if (sVar2 != 0xffffffffffffffff) {
      __pos = sVar1 + from->_M_string_length;
      bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_38,__pos,
                         sVar2 - __pos);
      __return_storage_ptr__->first = bVar3;
      goto LAB_0019311b;
    }
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&__return_storage_ptr__->first,"");
  sVar2 = 0;
LAB_0019311b:
  __return_storage_ptr__->second = sVar2;
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string_view, size_t> snip_between(std::string_view source, const std::string& from, const std::string& to, size_t start = 0) {
    const size_t begin = source.find(from, start);
    if (begin != std::string::npos) {
        const size_t end = source.find(to, begin + from.length());
        if (end != std::string::npos) {
            return { source.substr(begin + from.length(), end - (begin + from.length())), end };
        }
    }

    return { "", 0 };
}